

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  Entry *pEVar2;
  int *piVar3;
  FILE *pFVar4;
  QArrayData *pQVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  undefined8 *puVar10;
  char *pcVar11;
  long lVar12;
  undefined8 uVar13;
  char16_t *pcVar14;
  ulong uVar15;
  undefined8 *puVar16;
  bool bVar17;
  char16_t *pcVar18;
  char16_t *pcVar19;
  QHash<QString,_QtInstallDirectoryWithTriple> QVar20;
  long in_FS_OFFSET;
  QAnyStringView QVar21;
  Options options;
  QArrayData *local_6e8;
  undefined8 *puStack_6e0;
  undefined1 *local_6d8;
  Options local_6c8;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  int local_a4;
  undefined8 local_a0;
  char16_t *local_98;
  ulong local_90;
  undefined8 local_88;
  char16_t *local_80;
  ulong local_78;
  QString local_70;
  QArrayData *local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a4 = argc;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_b8,&local_a4,argv,0x60a00);
  memset(&local_6c8,0xaa,0x610);
  parseOptions();
  if ((local_6c8.helpRequested != false) || (local_6c8.outputDirectory.d.size == 0)) {
    main_cold_16();
    iVar9 = 1;
    goto LAB_0012cfb4;
  }
  QElapsedTimer::start();
  bVar7 = readInputFile(&local_6c8);
  iVar9 = 2;
  if (!bVar7) goto LAB_0012cfb4;
  if (local_6c8.timing == true) {
    main_cold_1();
  }
  pFVar4 = _stdout;
  QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)local_6c8.inputFileName.d.ptr);
  puVar16 = local_50;
  if (local_50 == (undefined8 *)0x0) {
    puVar16 = &QByteArray::_empty;
  }
  QString::toLocal8Bit_helper((QChar *)&local_70,(longlong)local_6c8.outputDirectory.d.ptr);
  pcVar14 = local_70.d.ptr;
  if (local_70.d.ptr == (char16_t *)0x0) {
    pcVar14 = (char16_t *)&QByteArray::_empty;
  }
  QString::toLocal8Bit_helper((QChar *)&local_88,(longlong)local_6c8.applicationBinary.d.ptr);
  pcVar18 = local_80;
  if (local_80 == (char16_t *)0x0) {
    pcVar18 = (char16_t *)&QByteArray::_empty;
  }
  QString::toLocal8Bit_helper((QChar *)&local_a0,(longlong)local_6c8.androidPlatform.d.ptr);
  pcVar19 = local_98;
  if (local_98 == (char16_t *)0x0) {
    pcVar19 = (char16_t *)&QByteArray::_empty;
  }
  if (local_6c8.installApk == true) {
    if (local_6c8.installLocation.d.size == 0) {
      pcVar11 = "Default device";
      goto LAB_0012c7ef;
    }
    QString::toLocal8Bit_helper((QChar *)&local_6e8,(longlong)local_6c8.installLocation.d.ptr);
    puVar10 = puStack_6e0;
    if (puStack_6e0 == (undefined8 *)0x0) {
      puVar10 = &QByteArray::_empty;
    }
    fprintf(pFVar4,
            "Generating Android Package\n  Input file: %s\n  Output directory: %s\n  Application binary: %s\n  Android build platform: %s\n  Install to device: %s\n"
            ,puVar16,pcVar14,pcVar18,pcVar19,puVar10);
    if (local_6e8 != (QArrayData *)0x0) {
      LOCK();
      (local_6e8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_6e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_6e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_6e8,1,0x10);
      }
    }
  }
  else {
    pcVar11 = "No";
LAB_0012c7ef:
    fprintf(pFVar4,
            "Generating Android Package\n  Input file: %s\n  Output directory: %s\n  Application binary: %s\n  Android build platform: %s\n  Install to device: %s\n"
            ,puVar16,pcVar14,pcVar18,pcVar19,pcVar11);
  }
  piVar3 = (int *)CONCAT71(local_a0._1_7_,(undefined1)local_a0);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_a0._1_7_,(undefined1)local_a0),1,0x10);
    }
  }
  piVar3 = (int *)CONCAT71(local_88._1_7_,(undefined1)local_88);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_88._1_7_,(undefined1)local_88),1,0x10);
    }
  }
  piVar3 = (int *)CONCAT71(local_70.d.d._1_7_,local_70.d.d._0_1_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT71(local_70.d.d._1_7_,local_70.d.d._0_1_),1,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,1,0x10);
    }
  }
  if (local_6c8.architectures.d == (Data *)0x0) {
    local_6c8.architectures.d = (Data *)0x0;
    uVar15 = 0;
LAB_0012c913:
    QVar20.d = local_6c8.architectures.d;
    if (uVar15 != 0 || local_6c8.architectures.d != (Data *)0x0) goto LAB_0012c91f;
  }
  else {
    if ((local_6c8.architectures.d)->spans->offsets[0] == 0xff) {
      uVar6 = 1;
      do {
        uVar15 = uVar6;
        if ((local_6c8.architectures.d)->numBuckets == uVar15) {
          local_6c8.architectures.d = (Data *)0x0;
          uVar15 = 0;
          break;
        }
        uVar6 = uVar15 + 1;
      } while ((local_6c8.architectures.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff)
      ;
      goto LAB_0012c913;
    }
    uVar15 = 0;
    QVar20.d = local_6c8.architectures.d;
LAB_0012c91f:
    bVar7 = false;
    do {
      pEVar2 = (QVar20.d)->spans[uVar15 >> 7].entries;
      bVar1 = (QVar20.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f];
      if (pEVar2[bVar1].storage.data[0x50] == '\x01') {
        Options::setCurrentQtArchitecture
                  (&local_6c8,(QString *)(pEVar2 + bVar1),
                   (QString *)(pEVar2[bVar1].storage.data + 0x18),
                   (QHash<QString,_QString> *)(pEVar2[bVar1].storage.data + 0x30));
        bVar17 = true;
        bVar8 = !bVar7;
        bVar7 = bVar17;
        if (bVar8) {
          if ((local_6c8.build == true) && (local_6c8.copyDependenciesOnly == false)) {
            cleanAndroidFiles(&local_6c8);
            if (local_6c8.timing == true) {
              main_cold_2();
            }
            bVar8 = copyAndroidTemplate(&local_6c8);
            if (!bVar8) {
              iVar9 = 3;
              goto LAB_0012cfb4;
            }
            if (local_6c8.timing == true) {
              main_cold_3();
            }
          }
          else {
            bVar7 = false;
          }
        }
        bVar8 = readDependencies(&local_6c8);
        if (!bVar8) {
          iVar9 = 4;
          goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_4();
        }
        bVar8 = copyQtFiles(&local_6c8);
        if (!bVar8) {
          iVar9 = 6;
          goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_5();
        }
        bVar8 = copyAndroidExtraLibs(&local_6c8);
        if (!bVar8) {
          iVar9 = 10;
          goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_6();
        }
        bVar8 = copyAndroidExtraResources(&local_6c8);
        if (!bVar8) {
          iVar9 = 0x13;
          goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_7();
        }
        bVar8 = copyStdCpp(&local_6c8);
        if (!bVar8) {
          iVar9 = 5;
          goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_8();
        }
        if ((local_6c8.generateJavaQmlComponents == true) &&
           (iVar9 = generateJavaQmlComponents(&local_6c8), iVar9 == 0)) {
          iVar9 = 0x16;
          goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_9();
        }
        if (local_6c8.deploymentMechanism == Unbundled) {
          local_6d8 = &DAT_aaaaaaaaaaaaaaaa;
          local_6e8 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_6e0 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
          local_70.d.size = local_6c8.outputDirectory.d.size | 0x8000000000000000;
          local_70.d.d._0_1_ = 1;
          local_70.d.ptr = local_6c8.outputDirectory.d.ptr;
          local_78 = local_6c8.currentArchitecture.d.size | 0x8000000000000000;
          local_88._0_1_ = 1;
          local_80 = local_6c8.currentArchitecture.d.ptr;
          local_90 = local_6c8.applicationBinary.d.size | 0x8000000000000000;
          local_a0._0_1_ = 1;
          local_98 = local_6c8.applicationBinary.d.ptr;
          local_58 = (QArrayData *)&local_70;
          local_50 = &local_88;
          local_48 = &local_a0;
          local_40 = 0;
          QVar21.m_size = (size_t)"%1/libs/%2/lib%3_%2.so";
          QVar21.field_0.m_data_utf8 = (char *)&local_6e8;
          QtPrivate::argToQString(QVar21,0x4000000000000016,(ArgBase **)0x3);
          QFile::remove((QString *)&local_6e8);
          if (local_6e8 != (QArrayData *)0x0) {
            LOCK();
            (local_6e8->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_6e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_6e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_6e8,2,0x10);
            }
          }
        }
        else {
          bVar8 = containsApplicationBinary(&local_6c8);
          if (!bVar8) {
            iVar9 = 7;
            goto LAB_0012cfb4;
          }
        }
        pFVar4 = _stdout;
        if (local_6c8.timing == true) {
          uVar13 = QElapsedTimer::nsecsElapsed();
          fprintf(pFVar4,"[TIMING] %lld ns: Checked for application binary\n",uVar13);
        }
        if ((local_6c8.timing & 1U) != 0) {
          main_cold_10();
        }
      }
      do {
        if ((QVar20.d)->numBuckets - 1 == uVar15) {
          uVar15 = 0;
          QVar20.d = (Data *)0x0;
          break;
        }
        uVar15 = uVar15 + 1;
      } while ((QVar20.d)->spans[uVar15 >> 7].offsets[(uint)uVar15 & 0x7f] == 0xff);
    } while ((uVar15 != 0) || (QVar20.d != (Data *)0x0));
  }
  if (local_6c8.copyDependenciesOnly == true) {
    iVar9 = 0;
    if (local_6c8.depFilePath.d.size != 0) {
      writeDependencyFile(&local_6c8);
      iVar9 = 0;
    }
  }
  else {
    bVar7 = createRcc(&local_6c8);
    iVar9 = 0x15;
    if (bVar7) {
      if (local_6c8.auxMode == true) {
        bVar7 = updateAndroidFiles(&local_6c8);
        iVar9 = 0xc;
        if (bVar7) {
          iVar9 = 0;
        }
      }
      else {
        if (local_6c8.build == true) {
          bVar7 = copyAndroidSources(&local_6c8);
          iVar9 = 0xb;
          if (!bVar7) goto LAB_0012cfb4;
          if (local_6c8.timing == true) {
            main_cold_11();
          }
          bVar7 = updateAndroidFiles(&local_6c8);
          pFVar4 = _stdout;
          iVar9 = 0xc;
          if (!bVar7) goto LAB_0012cfb4;
          if (local_6c8.timing == true) {
            uVar13 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar4,"[TIMING] %lld ns: Updated files\n",uVar13);
          }
          if ((local_6c8.timing & 1U) != 0) {
            main_cold_12();
          }
          bVar7 = buildAndroidProject(&local_6c8);
          iVar9 = 0xe;
          if (!bVar7) goto LAB_0012cfb4;
          if (local_6c8.timing == true) {
            main_cold_13();
          }
          if (local_6c8.keyStore.d.size != 0) {
            bVar7 = signPackage(&local_6c8);
            iVar9 = 0xf;
            if (!bVar7) goto LAB_0012cfb4;
          }
          if (local_6c8.apkPath.d.size != 0) {
            bVar7 = copyPackage(&local_6c8);
            iVar9 = 0x14;
            if (!bVar7) goto LAB_0012cfb4;
          }
          if (local_6c8.timing == true) {
            main_cold_14();
          }
        }
        if (local_6c8.installApk == true) {
          bVar7 = installApk(&local_6c8);
          iVar9 = 0x10;
          if (!bVar7) goto LAB_0012cfb4;
        }
        if (local_6c8.timing == true) {
          main_cold_15();
        }
        if (local_6c8.depFilePath.d.size != 0) {
          writeDependencyFile(&local_6c8);
        }
        pFVar4 = _stdout;
        lVar12 = QElapsedTimer::elapsed();
        fprintf(pFVar4,"Android package built successfully in %.3f ms.\n",(double)lVar12 / 1000.0);
        if (local_6c8.installApk == true) {
          fwrite("  -- It can now be run from the selected device/emulator.\n",0x3a,1,_stdout);
        }
        pFVar4 = _stdout;
        packagePath(&local_70,&local_6c8,SignedAPK - (local_6c8.keyStore.d.size == 0));
        QString::toLocal8Bit_helper((QChar *)&local_58,(longlong)local_70.d.ptr);
        puVar16 = local_50;
        if (local_50 == (undefined8 *)0x0) {
          puVar16 = &QByteArray::_empty;
        }
        fprintf(pFVar4,"  -- File: %s\n",puVar16);
        pQVar5 = local_58;
        if (local_58 != (QArrayData *)0x0) {
          LOCK();
          *(int *)&((DataPointer *)&local_58->ref_)->d =
               *(int *)&((DataPointer *)&local_58->ref_)->d + -1;
          UNLOCK();
          if (*(int *)&((DataPointer *)&pQVar5->ref_)->d == 0) {
            QArrayData::deallocate(local_58,1,0x10);
          }
        }
        piVar3 = (int *)CONCAT71(local_70.d.d._1_7_,local_70.d.d._0_1_);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            QArrayData::deallocate
                      ((QArrayData *)CONCAT71(local_70.d.d._1_7_,local_70.d.d._0_1_),2,0x10);
          }
        }
        fflush(_stdout);
        iVar9 = 0;
      }
    }
  }
LAB_0012cfb4:
  Options::~Options(&local_6c8);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar9;
}

Assistant:

int main(int argc, char *argv[])
{
    QCoreApplication a(argc, argv);

    Options options = parseOptions();
    if (options.helpRequested || options.outputDirectory.isEmpty()) {
        printHelp();
        return SyntaxErrorOrHelpRequested;
    }

    options.timer.start();

    if (!readInputFile(&options))
        return CannotReadInputFile;

    if (Q_UNLIKELY(options.timing))
        fprintf(stdout, "[TIMING] %lld ns: Read input file\n", options.timer.nsecsElapsed());

    fprintf(stdout,
            "Generating Android Package\n"
            "  Input file: %s\n"
            "  Output directory: %s\n"
            "  Application binary: %s\n"
            "  Android build platform: %s\n"
            "  Install to device: %s\n",
            qPrintable(options.inputFileName),
            qPrintable(options.outputDirectory),
            qPrintable(options.applicationBinary),
            qPrintable(options.androidPlatform),
            options.installApk
                ? (options.installLocation.isEmpty() ? "Default device" : qPrintable(options.installLocation))
                : "No"
            );

    bool androidTemplatetCopied = false;

    for (auto it = options.architectures.constBegin(); it != options.architectures.constEnd(); ++it) {
        if (!it->enabled)
            continue;
        options.setCurrentQtArchitecture(it.key(),
                                         it.value().qtInstallDirectory,
                                         it.value().qtDirectories);

        // All architectures have a copy of the gradle files but only one set needs to be copied.
        if (!androidTemplatetCopied && options.build && !options.copyDependenciesOnly) {
            cleanAndroidFiles(options);
            if (Q_UNLIKELY(options.timing))
                fprintf(stdout, "[TIMING] %lld ns: Cleaned Android file\n", options.timer.nsecsElapsed());

            if (!copyAndroidTemplate(options))
                return CannotCopyAndroidTemplate;

            if (Q_UNLIKELY(options.timing))
                fprintf(stdout, "[TIMING] %lld ns: Copied Android template\n", options.timer.nsecsElapsed());
            androidTemplatetCopied = true;
        }

        if (!readDependencies(&options))
            return CannotReadDependencies;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Read dependencies\n", options.timer.nsecsElapsed());

        if (!copyQtFiles(&options))
            return CannotCopyQtFiles;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied Qt files\n", options.timer.nsecsElapsed());

        if (!copyAndroidExtraLibs(&options))
            return CannotCopyAndroidExtraLibs;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ms: Copied extra libs\n", options.timer.nsecsElapsed());

        if (!copyAndroidExtraResources(&options))
            return CannotCopyAndroidExtraResources;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied extra resources\n", options.timer.nsecsElapsed());

        if (!copyStdCpp(&options))
            return CannotCopyGnuStl;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied GNU STL\n", options.timer.nsecsElapsed());

        if (options.generateJavaQmlComponents) {
            if (!generateJavaQmlComponents(options))
                return CannotGenerateJavaQmlComponents;
        }

        if (Q_UNLIKELY(options.timing)) {
            fprintf(stdout, "[TIMING] %lld ns: Generate Java QtQuickViewContents.\n",
                    options.timer.nsecsElapsed());
        }

        // If Unbundled deployment is used, remove app lib as we don't want it packaged inside the APK
        if (options.deploymentMechanism == Options::Unbundled) {
            QString appLibPath = "%1/libs/%2/lib%3_%2.so"_L1.
                    arg(options.outputDirectory,
                        options.currentArchitecture,
                        options.applicationBinary);
            QFile::remove(appLibPath);
        } else if (!containsApplicationBinary(&options)) {
            return CannotFindApplicationBinary;
        }

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Checked for application binary\n", options.timer.nsecsElapsed());

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Bundled Qt libs\n", options.timer.nsecsElapsed());
    }

    if (options.copyDependenciesOnly) {
        if (!options.depFilePath.isEmpty())
            writeDependencyFile(options);
        return 0;
    }

    if (!createRcc(options))
        return CannotCreateRcc;

    if (options.auxMode) {
        if (!updateAndroidFiles(options))
            return CannotUpdateAndroidFiles;
        return 0;
    }

    if (options.build) {
        if (!copyAndroidSources(options))
            return CannotCopyAndroidSources;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied android sources\n", options.timer.nsecsElapsed());

        if (!updateAndroidFiles(options))
            return CannotUpdateAndroidFiles;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Updated files\n", options.timer.nsecsElapsed());

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Created project\n", options.timer.nsecsElapsed());

        if (!buildAndroidProject(options))
            return CannotBuildAndroidProject;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Built project\n", options.timer.nsecsElapsed());

        if (!options.keyStore.isEmpty() && !signPackage(options))
            return CannotSignPackage;

        if (!options.apkPath.isEmpty() && !copyPackage(options))
            return CannotCopyApk;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Signed package\n", options.timer.nsecsElapsed());
    }

    if (options.installApk && !installApk(options))
        return CannotInstallApk;

    if (Q_UNLIKELY(options.timing))
        fprintf(stdout, "[TIMING] %lld ns: Installed APK\n", options.timer.nsecsElapsed());

    if (!options.depFilePath.isEmpty())
        writeDependencyFile(options);

    fprintf(stdout, "Android package built successfully in %.3f ms.\n", options.timer.elapsed() / 1000.);

    if (options.installApk)
        fprintf(stdout, "  -- It can now be run from the selected device/emulator.\n");

    fprintf(stdout, "  -- File: %s\n", qPrintable(packagePath(options, options.keyStore.isEmpty() ? UnsignedAPK
                                                                                              : SignedAPK)));
    fflush(stdout);
    return 0;
}